

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.cc
# Opt level: O1

bool __thiscall xsettingsd::ColorSetting::WriteBody(ColorSetting *this,DataWriter *writer)

{
  bool bVar1;
  
  bVar1 = DataWriter::WriteInt16(writer,this->red_);
  if (bVar1) {
    bVar1 = DataWriter::WriteInt16(writer,this->blue_);
    if (bVar1) {
      bVar1 = DataWriter::WriteInt16(writer,this->green_);
      if (bVar1) {
        bVar1 = DataWriter::WriteInt16(writer,this->alpha_);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ColorSetting::WriteBody(DataWriter* writer) const {
  // Note that XSETTINGS asks for RBG-order, not RGB.
  if (!writer->WriteInt16(red_))   return false;
  if (!writer->WriteInt16(blue_))  return false;
  if (!writer->WriteInt16(green_)) return false;
  if (!writer->WriteInt16(alpha_)) return false;
  return true;
}